

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

int __thiscall
Lodtalk::StackInterpreterProxy::returnInteger(StackInterpreterProxy *this,SmallIntegerValue value)

{
  StackInterpreter::pushIntegerObject(this->interpreter,value);
  StackInterpreter::returnTop(this->interpreter);
  return 0;
}

Assistant:

int StackInterpreterProxy::returnInteger(SmallIntegerValue value)
{
    interpreter->pushIntegerObject(value);
    interpreter->returnTop();
    return 0;
}